

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos)

{
  undefined8 uVar1;
  bool bVar2;
  ImRect *in_RSI;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  ImVec2 center;
  ImU32 text_col;
  ImU32 bg_col;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 uVar8;
  float lock_threshold;
  ImGuiWindow *window_00;
  ImGuiID in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  byte bVar10;
  uint in_stack_ffffffffffffffac;
  uint uVar9;
  bool *out_held;
  bool *in_stack_ffffffffffffffb8;
  ImGuiID id_00;
  ImVec2 bb_00;
  ImVec2 local_20;
  ImVec2 local_18;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  local_18 = (ImVec2)GImGui;
  local_20 = (ImVec2)GImGui->CurrentWindow;
  window_00 = (ImGuiWindow *)&stack0xffffffffffffffb8;
  ImVec2::ImVec2((ImVec2 *)window_00,GImGui->FontSize,GImGui->FontSize);
  auVar3._0_8_ = ::operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                             ,(ImVec2 *)0x1e2a0b);
  auVar3._8_56_ = extraout_var;
  uVar1 = vmovlpd_avx(auVar3._0_16_);
  id_00 = (ImGuiID)((ulong)uVar1 >> 0x20);
  auVar4._0_8_ = ::operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                             ,0.0);
  auVar4._8_56_ = extraout_var_00;
  out_held = (bool *)vmovlpd_avx(auVar4._0_16_);
  auVar5._0_8_ = ::operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                             ,(ImVec2 *)0x1e2a42);
  auVar5._8_56_ = extraout_var_01;
  bb_00 = (ImVec2)vmovlpd_avx(auVar5._0_16_);
  ImRect::ImRect((ImRect *)&stack0xffffffffffffffd0,&in_RSI->Min,(ImVec2 *)&stack0xffffffffffffffc8)
  ;
  ItemAdd((ImRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
          in_stack_ffffffffffffff94,in_RSI);
  bVar2 = ButtonBehavior((ImRect *)bb_00,id_00,in_stack_ffffffffffffffb8,out_held,
                         in_stack_ffffffffffffffac);
  uVar9 = (uint)CONCAT21((short)(in_stack_ffffffffffffffac >> 0x10),bVar2) << 8;
  if (((in_stack_ffffffffffffffac & 0x10000) == 0) || ((in_stack_ffffffffffffffac & 0x1000000) == 0)
     ) {
    lock_threshold = 2.94273e-44;
    if ((in_stack_ffffffffffffffac & 0x1000000) != 0) {
      lock_threshold = 3.08286e-44;
    }
  }
  else {
    lock_threshold = 3.22299e-44;
  }
  uVar8 = 0x3f800000;
  GetColorU32((ImGuiCol)((ulong)window_00 >> 0x20),SUB84(window_00,0));
  GetColorU32((ImGuiCol)((ulong)window_00 >> 0x20),SUB84(window_00,0));
  auVar6._0_8_ = ImRect::GetCenter((ImRect *)
                                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  auVar6._8_56_ = extraout_var_02;
  vmovlpd_avx(auVar6._0_16_);
  if (((uVar9 & 0x1000000) != 0) || ((uVar9 & 0x10000) != 0)) {
    ImDrawList::AddCircleFilled
              ((ImDrawList *)window_00,(ImVec2 *)CONCAT44(lock_threshold,uVar8),
               (float)((ulong)in_stack_ffffffffffffff70 >> 0x20),(ImU32)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c);
  }
  bVar10 = (byte)(uVar9 >> 8);
  auVar7._0_8_ = ::operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                             ,(ImVec2 *)0x1e2b81);
  auVar7._8_56_ = extraout_var_03;
  vmovlpd_avx(auVar7._0_16_);
  RenderArrow((ImDrawList *)window,(ImVec2)g,(ImU32)bb.Max.y,(ImGuiDir)bb.Max.x,bb.Min.y);
  bVar2 = IsItemActive();
  if ((bVar2) && (bVar2 = IsMouseDragging((ImGuiMouseButton)window_00,lock_threshold), bVar2)) {
    StartMouseMovingWindow(window_00);
  }
  return (bool)(bVar10 & 1);
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    // Render
    ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    ImVec2 center = bb.GetCenter();
    if (hovered || held)
        window->DrawList->AddCircleFilled(center/*+ ImVec2(0.0f, -0.5f)*/, g.FontSize * 0.5f + 1.0f, bg_col, 12);
    RenderArrow(window->DrawList, bb.Min + g.Style.FramePadding, text_col, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging(0))
        StartMouseMovingWindow(window);

    return pressed;
}